

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O1

string * kaitai::kstream::bytes_terminate
                   (string *__return_storage_ptr__,string *src,char term,bool include)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  
  if ((src->_M_string_length != 0) && (pcVar2 = (src->_M_dataplus)._M_p, *pcVar2 != term)) {
    sVar3 = 1;
    do {
      if (src->_M_string_length == sVar3) break;
      pcVar1 = pcVar2 + sVar3;
      sVar3 = sVar3 + 1;
    } while (*pcVar1 != term);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)src);
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::bytes_terminate(std::string src, char term, bool include) {
    std::size_t new_len = 0;
    std::size_t max_len = src.length();

    while (new_len < max_len && src[new_len] != term)
        new_len++;

    if (include && new_len < max_len)
        new_len++;

    return src.substr(0, new_len);
}